

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExporterT.hh
# Opt level: O0

Vec4ui __thiscall
OpenMesh::IO::ExporterT<OpenMesh::PolyMesh_ArrayKernelT<OpenMesh::DefaultTraits>_>::colorAi
          (ExporterT<OpenMesh::PolyMesh_ArrayKernelT<OpenMesh::DefaultTraits>_> *this,FaceHandle _fh
          )

{
  bool bVar1;
  undefined8 in_RDI;
  BaseHandle _fh_00;
  AttribKernelT<OpenMesh::FinalMeshItemsT<OpenMesh::DefaultTraits,_false>,_OpenMesh::PolyConnectivity>
  *in_stack_ffffffffffffffc8;
  container local_10;
  
  _fh_00.idx_ = (int)((ulong)in_RDI >> 0x20);
  bVar1 = AttribKernelT<OpenMesh::FinalMeshItemsT<OpenMesh::DefaultTraits,_false>,_OpenMesh::PolyConnectivity>
          ::has_face_colors((AttribKernelT<OpenMesh::FinalMeshItemsT<OpenMesh::DefaultTraits,_false>,_OpenMesh::PolyConnectivity>
                             *)0x1f3dc0);
  if (bVar1) {
    AttribKernelT<OpenMesh::FinalMeshItemsT<OpenMesh::DefaultTraits,_false>,_OpenMesh::PolyConnectivity>
    ::color(in_stack_ffffffffffffffc8,(FaceHandle)_fh_00.idx_);
    local_10._M_elems =
         (_Type)color_cast<OpenMesh::VectorT<unsigned_int,4>,OpenMesh::VectorT<unsigned_char,3>>
                          ((VectorT<unsigned_char,_3> *)0x1f3de8);
  }
  else {
    VectorT<unsigned_int,4>::VectorT<int,int,int,int,void,void>
              ((VectorT<unsigned_int,4> *)&local_10,0,0,0,0);
  }
  return (container)(container)local_10._M_elems;
}

Assistant:

Vec4ui  colorAi(FaceHandle _fh)   const override
  {
    return (mesh_.has_face_colors()
            ? color_cast<Vec4ui>(mesh_.color(_fh))
            : Vec4ui(0, 0, 0, 0));
  }